

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::
     verifySize(int NPL,int NPP)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>(in_RAX);
  }
  else {
    if (NPP < 1) {
      tools::Log::error<char_const*>(in_RAX);
      tools::Log::info<char_const*>(in_RAX);
      goto LAB_0013ec27;
    }
    if (((double)NPL / 12.0 == (double)NPP) && (!NAN((double)NPL / 12.0) && !NAN((double)NPP))) {
      return;
    }
    tools::Log::error<char_const*>(in_RAX);
  }
  tools::Log::info<char_const*>(in_RAX);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
LAB_0013ec27:
  tools::Log::info<char_const*,int>("NPP value: {}",NPP);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NPP ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 12 * NPP" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NPP value: {}", NPP );
    throw std::exception();
  }

  if ( NPP < 1 ) {

    Log::error( "Encountered illegal NPP value" );
    Log::info( "NPP should be larger than zero" );
    Log::info( "NPP value: {}", NPP );
    throw std::exception();
  }

  if ( NPL / 12. != NPP ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 12 * NPP" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NPP value: {}", NPP );
    throw std::exception();
  }
}